

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall yy::parser::error(parser *this,syntax_error *yyexc)

{
  char *__s;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  __s = (char *)(**(code **)(*(long *)yyexc + 0x10))(yyexc);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  (*this->_vptr_parser[3])(this,&yyexc->location,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void
  parser::error (const syntax_error& yyexc)
  {
    error (yyexc.location, yyexc.what ());
  }